

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STDAllocator.hpp
# Opt level: O0

void __thiscall
Diligent::
STDAllocator<std::_Rb_tree_node<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,Diligent::IMemoryAllocator>
::
STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>
          (STDAllocator<std::_Rb_tree_node<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,Diligent::IMemoryAllocator>
           *this,STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>
                 *other)

{
  STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>
  *other_local;
  STDAllocator<std::_Rb_tree_node<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_Diligent::IMemoryAllocator>
  *this_local;
  
  *(IMemoryAllocator **)this = other->m_Allocator;
  *(Char **)(this + 8) = other->m_dvpDescription;
  *(Char **)(this + 0x10) = other->m_dvpFileName;
  *(Int32 *)(this + 0x18) = other->m_dvpLineNumber;
  return;
}

Assistant:

STDAllocator(const STDAllocator<U, AllocatorType>& other) noexcept :
        // clang-format off
        m_Allocator     {other.m_Allocator}
#ifdef DILIGENT_DEVELOPMENT
      , m_dvpDescription{other.m_dvpDescription}
      , m_dvpFileName   {other.m_dvpFileName   }
      , m_dvpLineNumber {other.m_dvpLineNumber }
#endif
    // clang-format on
    {
    }